

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall
CTcSymBif::gen_code_call(CTcSymBif *this,int discard,int argc,int varargs,CTcNamedArgs *named_args)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  undefined *__n;
  void *__buf;
  void *extraout_RDX;
  void *__buf_00;
  void *__buf_01;
  void *extraout_RDX_00;
  void *__buf_02;
  void *extraout_RDX_01;
  void *__buf_03;
  char cVar4;
  int iVar5;
  CTcGenTarg *pCVar6;
  ushort *puVar7;
  
  if ((~G_cg->field_0xd0 & 0x18) == 0) {
    err_throw(0x9c5);
  }
  iVar5 = 0x2cf9;
  if ((argc < (this->super_CTcSymBifBase).min_argc_) ||
     ((((this->super_CTcSymBifBase).field_0x34 & 1) == 0 &&
      (iVar5 = 0x2cfa, (this->super_CTcSymBifBase).max_argc_ < argc)))) {
    CTcTokenizer::log_error
              (iVar5,(ulong)(uint)(this->super_CTcSymBifBase).super_CTcSymbol.super_CTcSymbolBase.
                                  super_CVmHashEntryCS.super_CVmHashEntry.len_,
               (this->super_CTcSymBifBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
               super_CVmHashEntry.str_);
  }
  if (varargs != 0) {
    CTcGenTarg::write_op(G_cg,'v');
  }
  puVar7 = &(this->super_CTcSymBifBase).func_set_id_;
  uVar3 = (ulong)(this->super_CTcSymBifBase).func_set_id_;
  uVar1 = (this->super_CTcSymBifBase).func_idx_;
  __n = (undefined *)(ulong)uVar1;
  cVar4 = (char)argc;
  if (uVar3 < 4) {
    if (uVar1 < 0x100) {
      puVar7 = &(this->super_CTcSymBifBase).func_idx_;
      __n = &DAT_002a951d;
      CTcGenTarg::write_op(G_cg,(&DAT_002a951d)[uVar3]);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)cVar4,__buf,(size_t)__n);
      __buf_03 = extraout_RDX;
      goto LAB_002122e2;
    }
  }
  else if (uVar1 < 0x100) {
    CTcGenTarg::write_op(G_cg,0xb5);
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)cVar4,__buf_00,(size_t)__n);
    CTcDataStream::write
              (&G_cs->super_CTcDataStream,(int)(char)(this->super_CTcSymBifBase).func_idx_,__buf_01,
               (size_t)__n);
    __buf_03 = extraout_RDX_00;
    goto LAB_002122e2;
  }
  CTcGenTarg::write_op(G_cg,0xb6);
  CTcDataStream::write(&G_cs->super_CTcDataStream,(int)cVar4,__buf_02,(size_t)__n);
  CTcDataStream::write2(&G_cs->super_CTcDataStream,(uint)(this->super_CTcSymBifBase).func_idx_);
  __buf_03 = extraout_RDX_01;
LAB_002122e2:
  pCVar6 = (CTcGenTarg *)G_cs;
  CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)*puVar7,__buf_03,(size_t)__n);
  G_cg->sp_depth_ = G_cg->sp_depth_ - argc;
  CTcGenTarg::post_call_cleanup(pCVar6,named_args);
  if (discard == 0) {
    CTcGenTarg::write_op(G_cg,0x8b);
    pCVar6 = G_cg;
    iVar2 = G_cg->sp_depth_;
    iVar5 = iVar2 + 1;
    G_cg->sp_depth_ = iVar5;
    if (pCVar6->max_sp_depth_ <= iVar2) {
      pCVar6->max_sp_depth_ = iVar5;
    }
  }
  return;
}

Assistant:

void CTcSymBif::gen_code_call(int discard, int argc, int varargs,
                              CTcNamedArgs *named_args)
{
    /* don't allow calling built-in functions in speculative mode */
    if (G_cg->is_speculative())
        err_throw(VMERR_BAD_SPEC_EVAL);
    
    /* check for minimum and maximum arguments */
    if (argc < min_argc_)
    {
        G_tok->log_error(TCERR_TOO_FEW_FUNC_ARGS,
                         (int)get_sym_len(), get_sym());
    }
    else if (!varargs_ && argc > max_argc_)
    {
        G_tok->log_error(TCERR_TOO_MANY_FUNC_ARGS,
                         (int)get_sym_len(), get_sym());
    }

    /* write the varargs modifier if appropriate */
    if (varargs)
        G_cg->write_op(OPC_VARARGC);

    /* generate the call */
    if (get_func_set_id() < 4 && get_func_idx() < 256)
    {
        uchar short_ops[] =
            { OPC_BUILTIN_A, OPC_BUILTIN_B, OPC_BUILTIN_C, OPC_BUILTIN_D };
        
        /* 
         *   it's one of the first 256 functions in one of the first four
         *   function sets - we can generate a short instruction 
         */
        G_cg->write_op(short_ops[get_func_set_id()]);
        G_cs->write((char)argc);
        G_cs->write((char)get_func_idx());
    }
    else
    {
        /* it's not in the default set - use the longer instruction */
        if (get_func_idx() < 256)
        {
            /* low function index - write the short form */
            G_cg->write_op(OPC_BUILTIN1);
            G_cs->write((char)argc);
            G_cs->write((char)get_func_idx());
        }
        else
        {
            /* big function index - write the long form */
            G_cg->write_op(OPC_BUILTIN2);
            G_cs->write((char)argc);
            G_cs->write2(get_func_idx());
        }

        /* write the function set ID */
        G_cs->write((char)get_func_set_id());
    }

    /* the built-in functions always remove arguments */
    G_cg->note_pop(argc);

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* 
     *   if they're not discarding the value, push it - the value is
     *   sitting in R0 after the call returns
     */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}